

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

void GEO::Process::enable_multithreading(bool flag)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  long lVar3;
  string local_30;
  
  if ((::(anonymous_namespace)::multithreading_initialized_ != '\x01') ||
     ((bool)::(anonymous_namespace)::multithreading_enabled_ != flag)) {
    ::(anonymous_namespace)::multithreading_initialized_ = '\x01';
    paVar1 = &local_30.field_2;
    ::(anonymous_namespace)::multithreading_enabled_ = flag;
    local_30._M_dataplus._M_p = (pointer)paVar1;
    if (flag) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Process","");
      poVar2 = Logger::out(&local_30);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Multithreading enabled",0x16);
      std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
      std::ostream::put((char)poVar2);
      poVar2 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Available cores = ",0x12);
      if (number_of_cores::result == 0) {
        lVar3 = sysconf(0x54);
        number_of_cores::result = (index_t)lVar3;
      }
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != paVar1) {
        operator_delete(local_30._M_dataplus._M_p);
      }
      if (number_of_cores::result == 0) {
        lVar3 = sysconf(0x54);
        number_of_cores::result = (index_t)lVar3;
      }
      if (number_of_cores::result == 1) {
        local_30._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Process","");
        poVar2 = Logger::warn(&local_30);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,"Processor is not a multicore",0x1c);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,"(or multithread is not supported)",0x21);
        std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_30._M_dataplus._M_p != paVar1) {
          operator_delete(local_30._M_dataplus._M_p);
        }
      }
      if (::(anonymous_namespace)::thread_manager_ != 0) {
        return;
      }
      local_30._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Process","");
      poVar2 = Logger::warn(&local_30);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"Missing multithreading manager",0x1e);
      std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Process","");
      poVar2 = Logger::out(&local_30);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Multithreading disabled",0x17);
      std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void enable_multithreading(bool flag) {
            if(
                multithreading_initialized_ &&
                multithreading_enabled_ == flag
            ) {
                return;
            }
            multithreading_initialized_ = true;
            multithreading_enabled_ = flag;
            if(multithreading_enabled_) {
                Logger::out("Process")
                    << "Multithreading enabled" << std::endl
                    << "Available cores = " << number_of_cores()
                    << std::endl;
                // Logger::out("Process")
                //    << "Max. concurrent threads = "
                //    << maximum_concurrent_threads() << std::endl ;
                if(number_of_cores() == 1) {
                    Logger::warn("Process")
                        << "Processor is not a multicore"
			<< "(or multithread is not supported)"
                        << std::endl;
                }
                if(thread_manager_ == nullptr) {
                    Logger::warn("Process")
                        << "Missing multithreading manager"
                        << std::endl;
                }
            } else {
                Logger::out("Process")
                    << "Multithreading disabled" << std::endl;
            }
        }